

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O1

int sam_format1(bam_hdr_t *h,bam1_t *b,kstring_t *str)

{
  uint8_t uVar1;
  char cVar2;
  byte bVar3;
  ushort uVar4;
  float fVar5;
  float fVar6;
  uint uVar7;
  char *pcVar8;
  ulong uVar9;
  long lVar10;
  char *pcVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  uint8_t *puVar16;
  ushort uVar17;
  byte *pbVar18;
  char cVar19;
  int iVar20;
  size_t sVar21;
  size_t sVar22;
  uint uVar23;
  size_t sVar24;
  double *pdVar25;
  bam1_t *pbVar26;
  int iVar27;
  double *pdVar28;
  double *pdVar29;
  int iVar30;
  long lVar31;
  byte bVar32;
  bool bVar33;
  double dVar34;
  char buf [16];
  undefined8 uStack_60;
  byte local_58 [16];
  bam1_t *local_48;
  undefined4 local_3c;
  bam_hdr_t *local_38;
  
  str->l = 0;
  puVar16 = b->data;
  bVar32 = (b->core).field_0xb;
  local_48 = b;
  local_38 = h;
  if ((ulong)bVar32 < str->m) {
LAB_0013e411:
    sVar21 = (ulong)bVar32 - 1;
    uStack_60 = 0x13e426;
    memcpy(str->s + str->l,puVar16,sVar21);
    sVar24 = sVar21 + str->l;
    str->l = sVar24;
    str->s[sVar24] = '\0';
  }
  else {
    bVar3 = bVar32 >> 1 | bVar32;
    bVar3 = bVar3 >> 2 | bVar3;
    sVar21 = (ulong)(byte)(bVar3 >> 4 | bVar3) + 1;
    str->m = sVar21;
    uStack_60 = 0x13e408;
    pcVar8 = (char *)realloc(str->s,sVar21);
    if (pcVar8 != (char *)0x0) {
      str->s = pcVar8;
      goto LAB_0013e411;
    }
  }
  pbVar26 = local_48;
  uVar9 = str->l + 1;
  if (uVar9 < str->m) {
LAB_0013e490:
    sVar24 = str->l;
    str->l = sVar24 + 1;
    str->s[sVar24] = '\t';
    str->s[str->l] = '\0';
  }
  else {
    uVar9 = uVar9 >> 1 | uVar9;
    uVar9 = uVar9 >> 2 | uVar9;
    uVar9 = uVar9 >> 4 | uVar9;
    uVar9 = uVar9 >> 8 | uVar9;
    sVar21 = (uVar9 >> 0x10 | uVar9) + 1;
    str->m = sVar21;
    uStack_60 = 0x13e487;
    pcVar8 = (char *)realloc(str->s,sVar21);
    if (pcVar8 != (char *)0x0) {
      str->s = pcVar8;
      goto LAB_0013e490;
    }
  }
  lVar10 = 0;
  uVar9 = 0;
  uVar7 = (uint)*(ushort *)&(pbVar26->core).field_0xc;
  do {
    uVar12 = uVar9;
    local_58[uVar12] = (char)uVar7 + (char)(uVar7 / 10) * -10 | 0x30;
    lVar10 = lVar10 + 0x100000000;
    bVar33 = 9 < uVar7;
    uVar9 = uVar12 + 1;
    uVar7 = uVar7 / 10;
  } while (bVar33);
  uVar9 = (lVar10 >> 0x20) + str->l + 1;
  if (uVar9 < str->m) {
LAB_0013e558:
    uVar9 = uVar12 + 2;
    pbVar18 = local_58 + (uVar12 + 1 & 0xffffffff);
    do {
      pbVar18 = pbVar18 + -1;
      bVar32 = *pbVar18;
      sVar24 = str->l;
      str->l = sVar24 + 1;
      str->s[sVar24] = bVar32;
      uVar7 = (int)uVar9 - 1;
      uVar9 = (ulong)uVar7;
    } while (1 < (int)uVar7);
    str->s[str->l] = '\0';
  }
  else {
    uVar9 = uVar9 >> 1 | uVar9;
    uVar9 = uVar9 >> 2 | uVar9;
    uVar9 = uVar9 >> 4 | uVar9;
    uVar9 = uVar9 >> 8 | uVar9;
    sVar21 = (uVar9 >> 0x10 | uVar9) + 1;
    str->m = sVar21;
    uStack_60 = 0x13e545;
    pcVar8 = (char *)realloc(str->s,sVar21);
    if (pcVar8 != (char *)0x0) {
      str->s = pcVar8;
      goto LAB_0013e558;
    }
  }
  uVar9 = str->l + 1;
  if (uVar9 < str->m) {
LAB_0013e5ed:
    sVar24 = str->l;
    str->l = sVar24 + 1;
    str->s[sVar24] = '\t';
    str->s[str->l] = '\0';
  }
  else {
    uVar9 = uVar9 >> 1 | uVar9;
    uVar9 = uVar9 >> 2 | uVar9;
    uVar9 = uVar9 >> 4 | uVar9;
    uVar9 = uVar9 >> 8 | uVar9;
    sVar21 = (uVar9 >> 0x10 | uVar9) + 1;
    str->m = sVar21;
    uStack_60 = 0x13e5da;
    pcVar8 = (char *)realloc(str->s,sVar21);
    if (pcVar8 != (char *)0x0) {
      str->s = pcVar8;
      goto LAB_0013e5ed;
    }
  }
  lVar10 = (long)(pbVar26->core).tid;
  if (lVar10 < 0) {
    uVar9 = str->l + 3;
    if (uVar9 < str->m) {
LAB_0013e798:
      sVar24 = str->l;
      pcVar8 = str->s;
      (pcVar8 + sVar24)[0] = '*';
      (pcVar8 + sVar24)[1] = '\t';
      sVar24 = str->l + 2;
      str->l = sVar24;
      pcVar8 = str->s + sVar24;
      goto LAB_0013e7b3;
    }
    uVar9 = uVar9 >> 1 | uVar9;
    uVar9 = uVar9 >> 2 | uVar9;
    uVar9 = uVar9 >> 4 | uVar9;
    uVar9 = uVar9 >> 8 | uVar9;
    sVar21 = (uVar9 >> 0x10 | uVar9) + 1;
    str->m = sVar21;
    uStack_60 = 0x13e785;
    pcVar8 = (char *)realloc(str->s,sVar21);
    if (pcVar8 != (char *)0x0) {
      str->s = pcVar8;
      goto LAB_0013e798;
    }
  }
  else {
    pcVar8 = local_38->target_name[lVar10];
    uStack_60 = 0x13e62b;
    sVar21 = strlen(pcVar8);
    sVar21 = (size_t)(int)sVar21;
    uVar9 = str->l + sVar21 + 1;
    if (uVar9 < str->m) {
LAB_0013e688:
      uStack_60 = 0x13e69a;
      memcpy(str->s + str->l,pcVar8,sVar21);
      sVar24 = sVar21 + str->l;
      str->l = sVar24;
      str->s[sVar24] = '\0';
    }
    else {
      uVar9 = uVar9 >> 1 | uVar9;
      uVar9 = uVar9 >> 2 | uVar9;
      uVar9 = uVar9 >> 4 | uVar9;
      uVar9 = uVar9 >> 8 | uVar9;
      sVar22 = (uVar9 >> 0x10 | uVar9) + 1;
      str->m = sVar22;
      uStack_60 = 0x13e67f;
      pcVar11 = (char *)realloc(str->s,sVar22);
      if (pcVar11 != (char *)0x0) {
        str->s = pcVar11;
        goto LAB_0013e688;
      }
    }
    pbVar26 = local_48;
    uVar9 = str->l + 1;
    if (str->m <= uVar9) {
      uVar9 = uVar9 >> 1 | uVar9;
      uVar9 = uVar9 >> 2 | uVar9;
      uVar9 = uVar9 >> 4 | uVar9;
      uVar9 = uVar9 >> 8 | uVar9;
      sVar21 = (uVar9 >> 0x10 | uVar9) + 1;
      str->m = sVar21;
      uStack_60 = 0x13e6fb;
      pcVar8 = (char *)realloc(str->s,sVar21);
      if (pcVar8 == (char *)0x0) goto LAB_0013e7b6;
      str->s = pcVar8;
    }
    sVar24 = str->l;
    str->l = sVar24 + 1;
    str->s[sVar24] = '\t';
    pcVar8 = str->s + str->l;
LAB_0013e7b3:
    *pcVar8 = '\0';
  }
LAB_0013e7b6:
  iVar27 = (pbVar26->core).pos;
  uVar7 = iVar27 + 1;
  uVar23 = -uVar7;
  if (0 < (int)uVar7) {
    uVar23 = uVar7;
  }
  uVar9 = 0;
  do {
    local_58[uVar9] = (char)uVar23 + (char)(uVar23 / 10) * -10 | 0x30;
    uVar9 = uVar9 + 1;
    bVar33 = 9 < uVar23;
    uVar23 = uVar23 / 10;
  } while (bVar33);
  if (iVar27 < -1) {
    uVar12 = uVar9 & 0xffffffff;
    uVar9 = (ulong)((int)uVar9 + 1);
    local_58[uVar12] = 0x2d;
  }
  uVar12 = str->l + (long)(int)uVar9 + 1;
  if (uVar12 < str->m) {
LAB_0013e869:
    iVar27 = (int)uVar9 + 1;
    pbVar18 = local_58 + (uVar9 & 0xffffffff);
    do {
      pbVar18 = pbVar18 + -1;
      bVar32 = *pbVar18;
      sVar24 = str->l;
      str->l = sVar24 + 1;
      str->s[sVar24] = bVar32;
      iVar27 = iVar27 + -1;
    } while (1 < iVar27);
    str->s[str->l] = '\0';
  }
  else {
    uVar12 = uVar12 >> 1 | uVar12;
    uVar12 = uVar12 >> 2 | uVar12;
    uVar12 = uVar12 >> 4 | uVar12;
    uVar12 = uVar12 >> 8 | uVar12;
    sVar21 = (uVar12 >> 0x10 | uVar12) + 1;
    str->m = sVar21;
    uStack_60 = 0x13e856;
    pcVar8 = (char *)realloc(str->s,sVar21);
    if (pcVar8 != (char *)0x0) {
      str->s = pcVar8;
      goto LAB_0013e869;
    }
  }
  uVar9 = str->l + 1;
  if (uVar9 < str->m) {
LAB_0013e902:
    sVar24 = str->l;
    str->l = sVar24 + 1;
    str->s[sVar24] = '\t';
    str->s[str->l] = '\0';
  }
  else {
    uVar9 = uVar9 >> 1 | uVar9;
    uVar9 = uVar9 >> 2 | uVar9;
    uVar9 = uVar9 >> 4 | uVar9;
    uVar9 = uVar9 >> 8 | uVar9;
    sVar21 = (uVar9 >> 0x10 | uVar9) + 1;
    str->m = sVar21;
    uStack_60 = 0x13e8ef;
    pcVar8 = (char *)realloc(str->s,sVar21);
    if (pcVar8 != (char *)0x0) {
      str->s = pcVar8;
      goto LAB_0013e902;
    }
  }
  lVar10 = 0;
  uVar9 = 0;
  uVar7 = (uint)(byte)(pbVar26->core).field_0xa;
  do {
    uVar12 = uVar9;
    local_58[uVar12] = (char)uVar7 + (char)(uVar7 / 10) * -10 | 0x30;
    lVar10 = lVar10 + 0x100000000;
    bVar33 = 9 < uVar7;
    uVar9 = uVar12 + 1;
    uVar7 = uVar7 / 10;
  } while (bVar33);
  uVar9 = (lVar10 >> 0x20) + str->l + 1;
  if (uVar9 < str->m) {
LAB_0013e9c0:
    uVar9 = uVar12 + 2;
    pbVar18 = local_58 + (uVar12 + 1 & 0xffffffff);
    do {
      pbVar18 = pbVar18 + -1;
      bVar32 = *pbVar18;
      sVar24 = str->l;
      str->l = sVar24 + 1;
      str->s[sVar24] = bVar32;
      uVar7 = (int)uVar9 - 1;
      uVar9 = (ulong)uVar7;
    } while (1 < (int)uVar7);
    str->s[str->l] = '\0';
  }
  else {
    uVar9 = uVar9 >> 1 | uVar9;
    uVar9 = uVar9 >> 2 | uVar9;
    uVar9 = uVar9 >> 4 | uVar9;
    uVar9 = uVar9 >> 8 | uVar9;
    sVar21 = (uVar9 >> 0x10 | uVar9) + 1;
    str->m = sVar21;
    uStack_60 = 0x13e9ad;
    pcVar8 = (char *)realloc(str->s,sVar21);
    if (pcVar8 != (char *)0x0) {
      str->s = pcVar8;
      goto LAB_0013e9c0;
    }
  }
  uVar9 = str->l + 1;
  if (uVar9 < str->m) {
LAB_0013ea55:
    sVar24 = str->l;
    str->l = sVar24 + 1;
    str->s[sVar24] = '\t';
    str->s[str->l] = '\0';
  }
  else {
    uVar9 = uVar9 >> 1 | uVar9;
    uVar9 = uVar9 >> 2 | uVar9;
    uVar9 = uVar9 >> 4 | uVar9;
    uVar9 = uVar9 >> 8 | uVar9;
    sVar21 = (uVar9 >> 0x10 | uVar9) + 1;
    str->m = sVar21;
    uStack_60 = 0x13ea42;
    pcVar8 = (char *)realloc(str->s,sVar21);
    if (pcVar8 != (char *)0x0) {
      str->s = pcVar8;
      goto LAB_0013ea55;
    }
  }
  uVar9 = *(ulong *)&(pbVar26->core).field_0x8;
  if (uVar9 >> 0x30 == 0) {
    uVar9 = str->l + 1;
    if (str->m <= uVar9) {
      uVar9 = uVar9 >> 1 | uVar9;
      uVar9 = uVar9 >> 2 | uVar9;
      uVar9 = uVar9 >> 4 | uVar9;
      uVar9 = uVar9 >> 8 | uVar9;
      sVar21 = (uVar9 >> 0x10 | uVar9) + 1;
      str->m = sVar21;
      uStack_60 = 0x13ead0;
      pcVar8 = (char *)realloc(str->s,sVar21);
      if (pcVar8 == (char *)0x0) goto LAB_0013ecc2;
      str->s = pcVar8;
    }
    sVar24 = str->l;
    str->l = sVar24 + 1;
    str->s[sVar24] = '*';
    str->s[str->l] = '\0';
  }
  else if (0xffffffffffff < *(ulong *)&(pbVar26->core).field_0x8) {
    uVar12 = uVar9 >> 0x18 & 0xff;
    puVar16 = local_48->data;
    uVar9 = 0;
    do {
      uVar23 = 1;
      lVar10 = 0;
      lVar15 = 0;
      uVar7 = *(uint *)(puVar16 + uVar9 * 4 + uVar12) >> 4;
      iVar27 = 2;
      do {
        iVar30 = iVar27;
        uVar14 = (ulong)uVar23;
        local_58[lVar15] = (char)uVar7 + (char)(uVar7 / 10) * -10 | 0x30;
        lVar15 = lVar15 + 1;
        lVar10 = lVar10 + 0x100000000;
        uVar23 = uVar23 + 1;
        bVar33 = 9 < uVar7;
        uVar7 = uVar7 / 10;
        iVar27 = iVar30 + 1;
      } while (bVar33);
      uVar13 = (lVar10 >> 0x20) + str->l + 1;
      if (uVar13 < str->m) {
LAB_0013ebe9:
        pbVar18 = local_58 + (uVar14 - 1);
        do {
          bVar32 = *pbVar18;
          sVar24 = str->l;
          str->l = sVar24 + 1;
          str->s[sVar24] = bVar32;
          iVar30 = iVar30 + -1;
          pbVar18 = pbVar18 + -1;
        } while (1 < iVar30);
        str->s[str->l] = '\0';
      }
      else {
        uVar13 = uVar13 >> 1 | uVar13;
        uVar13 = uVar13 >> 2 | uVar13;
        uVar13 = uVar13 >> 4 | uVar13;
        uVar13 = uVar13 >> 8 | uVar13;
        sVar21 = (uVar13 >> 0x10 | uVar13) + 1;
        str->m = sVar21;
        uStack_60 = 0x13ebd6;
        pcVar8 = (char *)realloc(str->s,sVar21);
        if (pcVar8 != (char *)0x0) {
          str->s = pcVar8;
          goto LAB_0013ebe9;
        }
      }
      cVar19 = "MIDNSHP=XB"[*(uint *)(puVar16 + uVar9 * 4 + uVar12) & 0xf];
      uVar14 = str->l + 1;
      if (uVar14 < str->m) {
LAB_0013ec90:
        sVar24 = str->l;
        str->l = sVar24 + 1;
        str->s[sVar24] = cVar19;
        str->s[str->l] = '\0';
      }
      else {
        uVar14 = uVar14 >> 1 | uVar14;
        uVar14 = uVar14 >> 2 | uVar14;
        uVar14 = uVar14 >> 4 | uVar14;
        uVar14 = uVar14 >> 8 | uVar14;
        sVar21 = (uVar14 >> 0x10 | uVar14) + 1;
        str->m = sVar21;
        uStack_60 = 0x13ec7d;
        pcVar8 = (char *)realloc(str->s,sVar21);
        if (pcVar8 != (char *)0x0) {
          str->s = pcVar8;
          goto LAB_0013ec90;
        }
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 < *(ushort *)&(local_48->core).field_0xe);
  }
LAB_0013ecc2:
  pbVar26 = local_48;
  uVar9 = str->l + 1;
  if (uVar9 < str->m) {
LAB_0013ed27:
    sVar24 = str->l;
    str->l = sVar24 + 1;
    str->s[sVar24] = '\t';
    str->s[str->l] = '\0';
  }
  else {
    uVar9 = uVar9 >> 1 | uVar9;
    uVar9 = uVar9 >> 2 | uVar9;
    uVar9 = uVar9 >> 4 | uVar9;
    uVar9 = uVar9 >> 8 | uVar9;
    sVar21 = (uVar9 >> 0x10 | uVar9) + 1;
    str->m = sVar21;
    uStack_60 = 0x13ed14;
    pcVar8 = (char *)realloc(str->s,sVar21);
    if (pcVar8 != (char *)0x0) {
      str->s = pcVar8;
      goto LAB_0013ed27;
    }
  }
  iVar27 = (pbVar26->core).mtid;
  if ((long)iVar27 < 0) {
    uVar9 = str->l + 3;
    if (uVar9 < str->m) {
LAB_0013ee30:
      sVar24 = str->l;
      pcVar8 = str->s;
      (pcVar8 + sVar24)[0] = '*';
      (pcVar8 + sVar24)[1] = '\t';
      goto LAB_0013ee3d;
    }
    uVar9 = uVar9 >> 1 | uVar9;
    uVar9 = uVar9 >> 2 | uVar9;
    uVar9 = uVar9 >> 4 | uVar9;
    uVar9 = uVar9 >> 8 | uVar9;
    sVar21 = (uVar9 >> 0x10 | uVar9) + 1;
    str->m = sVar21;
    uStack_60 = 0x13ee19;
    pcVar8 = (char *)realloc(str->s,sVar21);
    if (pcVar8 != (char *)0x0) {
      str->s = pcVar8;
      goto LAB_0013ee30;
    }
  }
  else {
    if (iVar27 == (pbVar26->core).tid) {
      uVar9 = str->l + 3;
      if (str->m <= uVar9) {
        uVar9 = uVar9 >> 1 | uVar9;
        uVar9 = uVar9 >> 2 | uVar9;
        uVar9 = uVar9 >> 4 | uVar9;
        uVar9 = uVar9 >> 8 | uVar9;
        sVar21 = (uVar9 >> 0x10 | uVar9) + 1;
        str->m = sVar21;
        uStack_60 = 0x13eda5;
        pcVar8 = (char *)realloc(str->s,sVar21);
        if (pcVar8 == (char *)0x0) goto LAB_0013ef69;
        str->s = pcVar8;
      }
      sVar24 = str->l;
      pcVar8 = str->s;
      (pcVar8 + sVar24)[0] = '=';
      (pcVar8 + sVar24)[1] = '\t';
LAB_0013ee3d:
      sVar24 = str->l + 2;
      str->l = sVar24;
      pcVar8 = str->s + sVar24;
    }
    else {
      pcVar8 = local_38->target_name[iVar27];
      uStack_60 = 0x13ee65;
      sVar21 = strlen(pcVar8);
      sVar21 = (size_t)(int)sVar21;
      uVar9 = str->l + sVar21 + 1;
      if (uVar9 < str->m) {
LAB_0013eec2:
        uStack_60 = 0x13eed4;
        memcpy(str->s + str->l,pcVar8,sVar21);
        sVar24 = sVar21 + str->l;
        str->l = sVar24;
        str->s[sVar24] = '\0';
      }
      else {
        uVar9 = uVar9 >> 1 | uVar9;
        uVar9 = uVar9 >> 2 | uVar9;
        uVar9 = uVar9 >> 4 | uVar9;
        uVar9 = uVar9 >> 8 | uVar9;
        sVar22 = (uVar9 >> 0x10 | uVar9) + 1;
        str->m = sVar22;
        uStack_60 = 0x13eeb9;
        pcVar11 = (char *)realloc(str->s,sVar22);
        if (pcVar11 != (char *)0x0) {
          str->s = pcVar11;
          goto LAB_0013eec2;
        }
      }
      uVar9 = str->l + 1;
      if (str->m <= uVar9) {
        uVar9 = uVar9 >> 1 | uVar9;
        uVar9 = uVar9 >> 2 | uVar9;
        uVar9 = uVar9 >> 4 | uVar9;
        uVar9 = uVar9 >> 8 | uVar9;
        sVar21 = (uVar9 >> 0x10 | uVar9) + 1;
        str->m = sVar21;
        uStack_60 = 0x13ef30;
        pcVar8 = (char *)realloc(str->s,sVar21);
        if (pcVar8 == (char *)0x0) goto LAB_0013ef69;
        str->s = pcVar8;
      }
      sVar24 = str->l;
      str->l = sVar24 + 1;
      str->s[sVar24] = '\t';
      pcVar8 = str->s + str->l;
    }
    *pcVar8 = '\0';
  }
LAB_0013ef69:
  iVar27 = (pbVar26->core).mpos;
  uVar7 = iVar27 + 1;
  uVar23 = -uVar7;
  if (0 < (int)uVar7) {
    uVar23 = uVar7;
  }
  uVar9 = 0;
  do {
    local_58[uVar9] = (char)uVar23 + (char)(uVar23 / 10) * -10 | 0x30;
    uVar9 = uVar9 + 1;
    bVar33 = 9 < uVar23;
    uVar23 = uVar23 / 10;
  } while (bVar33);
  if (iVar27 < -1) {
    uVar12 = uVar9 & 0xffffffff;
    uVar9 = (ulong)((int)uVar9 + 1);
    local_58[uVar12] = 0x2d;
  }
  uVar12 = str->l + (long)(int)uVar9 + 1;
  if (uVar12 < str->m) {
LAB_0013f01c:
    iVar27 = (int)uVar9 + 1;
    pbVar18 = local_58 + (uVar9 & 0xffffffff);
    do {
      pbVar18 = pbVar18 + -1;
      bVar32 = *pbVar18;
      sVar24 = str->l;
      str->l = sVar24 + 1;
      str->s[sVar24] = bVar32;
      iVar27 = iVar27 + -1;
    } while (1 < iVar27);
    str->s[str->l] = '\0';
  }
  else {
    uVar12 = uVar12 >> 1 | uVar12;
    uVar12 = uVar12 >> 2 | uVar12;
    uVar12 = uVar12 >> 4 | uVar12;
    uVar12 = uVar12 >> 8 | uVar12;
    sVar21 = (uVar12 >> 0x10 | uVar12) + 1;
    str->m = sVar21;
    uStack_60 = 0x13f009;
    pcVar8 = (char *)realloc(str->s,sVar21);
    if (pcVar8 != (char *)0x0) {
      str->s = pcVar8;
      goto LAB_0013f01c;
    }
  }
  uVar9 = str->l + 1;
  if (uVar9 < str->m) {
LAB_0013f0b5:
    sVar24 = str->l;
    str->l = sVar24 + 1;
    str->s[sVar24] = '\t';
    str->s[str->l] = '\0';
  }
  else {
    uVar9 = uVar9 >> 1 | uVar9;
    uVar9 = uVar9 >> 2 | uVar9;
    uVar9 = uVar9 >> 4 | uVar9;
    uVar9 = uVar9 >> 8 | uVar9;
    sVar21 = (uVar9 >> 0x10 | uVar9) + 1;
    str->m = sVar21;
    uStack_60 = 0x13f0a2;
    pcVar8 = (char *)realloc(str->s,sVar21);
    if (pcVar8 != (char *)0x0) {
      str->s = pcVar8;
      goto LAB_0013f0b5;
    }
  }
  uVar7 = (pbVar26->core).isize;
  uVar23 = -uVar7;
  if (0 < (int)uVar7) {
    uVar23 = uVar7;
  }
  uVar9 = 0;
  do {
    local_58[uVar9] = (char)uVar23 + (char)(uVar23 / 10) * -10 | 0x30;
    uVar9 = uVar9 + 1;
    bVar33 = 9 < uVar23;
    uVar23 = uVar23 / 10;
  } while (bVar33);
  if ((int)uVar7 < 0) {
    uVar12 = uVar9 & 0xffffffff;
    uVar9 = (ulong)((int)uVar9 + 1);
    local_58[uVar12] = 0x2d;
  }
  uVar12 = str->l + (long)(int)uVar9 + 1;
  if (uVar12 < str->m) {
LAB_0013f181:
    iVar27 = (int)uVar9 + 1;
    pbVar18 = local_58 + (uVar9 & 0xffffffff);
    do {
      pbVar18 = pbVar18 + -1;
      bVar32 = *pbVar18;
      sVar24 = str->l;
      str->l = sVar24 + 1;
      str->s[sVar24] = bVar32;
      iVar27 = iVar27 + -1;
    } while (1 < iVar27);
    str->s[str->l] = '\0';
  }
  else {
    uVar12 = uVar12 >> 1 | uVar12;
    uVar12 = uVar12 >> 2 | uVar12;
    uVar12 = uVar12 >> 4 | uVar12;
    uVar12 = uVar12 >> 8 | uVar12;
    sVar21 = (uVar12 >> 0x10 | uVar12) + 1;
    str->m = sVar21;
    uStack_60 = 0x13f16e;
    pcVar8 = (char *)realloc(str->s,sVar21);
    if (pcVar8 != (char *)0x0) {
      str->s = pcVar8;
      goto LAB_0013f181;
    }
  }
  uVar9 = str->l + 1;
  if (uVar9 < str->m) {
LAB_0013f21a:
    sVar24 = str->l;
    str->l = sVar24 + 1;
    str->s[sVar24] = '\t';
    str->s[str->l] = '\0';
  }
  else {
    uVar9 = uVar9 >> 1 | uVar9;
    uVar9 = uVar9 >> 2 | uVar9;
    uVar9 = uVar9 >> 4 | uVar9;
    uVar9 = uVar9 >> 8 | uVar9;
    sVar21 = (uVar9 >> 0x10 | uVar9) + 1;
    str->m = sVar21;
    uStack_60 = 0x13f207;
    pcVar8 = (char *)realloc(str->s,sVar21);
    if (pcVar8 != (char *)0x0) {
      str->s = pcVar8;
      goto LAB_0013f21a;
    }
  }
  if ((pbVar26->core).l_qseq == 0) {
    uVar9 = str->l + 4;
    if (str->m <= uVar9) {
      uVar9 = uVar9 >> 1 | uVar9;
      uVar9 = uVar9 >> 2 | uVar9;
      uVar9 = uVar9 >> 4 | uVar9;
      uVar9 = uVar9 >> 8 | uVar9;
      sVar21 = (uVar9 >> 0x10 | uVar9) + 1;
      str->m = sVar21;
      uStack_60 = 0x13f4c4;
      pcVar8 = (char *)realloc(str->s,sVar21);
      if (pcVar8 == (char *)0x0) goto LAB_0013f579;
      str->s = pcVar8;
    }
    sVar24 = str->l;
    pcVar8 = str->s;
    pcVar8[sVar24 + 2] = '*';
    pcVar8 = pcVar8 + sVar24;
    pcVar8[0] = '*';
    pcVar8[1] = '\t';
    sVar24 = str->l + 3;
    str->l = sVar24;
    pcVar8 = str->s + sVar24;
  }
  else {
    if (0 < (pbVar26->core).l_qseq) {
      uVar9 = *(ulong *)&(pbVar26->core).field_0x8;
      puVar16 = pbVar26->data;
      bVar32 = 0;
      uVar7 = 0;
      do {
        cVar19 = "=ACMGRSVTWYHKDBN"
                 [puVar16[(ulong)(uVar7 >> 1) + (uVar9 >> 0x18 & 0xff) + (uVar9 >> 0x30) * 4] >>
                  (~bVar32 & 4) & 0xf];
        uVar12 = str->l + 1;
        if (uVar12 < str->m) {
LAB_0013f2ed:
          sVar24 = str->l;
          str->l = sVar24 + 1;
          str->s[sVar24] = cVar19;
          str->s[str->l] = '\0';
        }
        else {
          uVar12 = uVar12 >> 1 | uVar12;
          uVar12 = uVar12 >> 2 | uVar12;
          uVar12 = uVar12 >> 4 | uVar12;
          uVar12 = uVar12 >> 8 | uVar12;
          sVar21 = (uVar12 >> 0x10 | uVar12) + 1;
          str->m = sVar21;
          uStack_60 = 0x13f2da;
          pcVar8 = (char *)realloc(str->s,sVar21);
          if (pcVar8 != (char *)0x0) {
            str->s = pcVar8;
            goto LAB_0013f2ed;
          }
        }
        uVar7 = uVar7 + 1;
        bVar32 = bVar32 + 4;
        pbVar26 = local_48;
      } while ((int)uVar7 < (local_48->core).l_qseq);
    }
    uVar9 = str->l + 1;
    if (uVar9 < str->m) {
LAB_0013f37f:
      sVar24 = str->l;
      str->l = sVar24 + 1;
      str->s[sVar24] = '\t';
      str->s[str->l] = '\0';
    }
    else {
      uVar9 = uVar9 >> 1 | uVar9;
      uVar9 = uVar9 >> 2 | uVar9;
      uVar9 = uVar9 >> 4 | uVar9;
      uVar9 = uVar9 >> 8 | uVar9;
      sVar21 = (uVar9 >> 0x10 | uVar9) + 1;
      str->m = sVar21;
      uStack_60 = 0x13f36c;
      pcVar8 = (char *)realloc(str->s,sVar21);
      if (pcVar8 != (char *)0x0) {
        str->s = pcVar8;
        goto LAB_0013f37f;
      }
    }
    uVar9 = *(ulong *)&(pbVar26->core).field_0x8;
    puVar16 = pbVar26->data;
    lVar10 = (uVar9 >> 0x18 & 0xff) + (uVar9 >> 0x30) * 4;
    lVar15 = (long)((pbVar26->core).l_qseq + 1 >> 1);
    if (puVar16[lVar15 + lVar10] != 0xff) {
      if (0 < (pbVar26->core).l_qseq) {
        lVar31 = 0;
        do {
          uVar1 = puVar16[lVar31 + lVar15 + lVar10];
          uVar9 = str->l + 1;
          if (uVar9 < str->m) {
LAB_0013f440:
            sVar24 = str->l;
            str->l = sVar24 + 1;
            str->s[sVar24] = uVar1 + '!';
            str->s[str->l] = '\0';
          }
          else {
            uVar9 = uVar9 >> 1 | uVar9;
            uVar9 = uVar9 >> 2 | uVar9;
            uVar9 = uVar9 >> 4 | uVar9;
            uVar9 = uVar9 >> 8 | uVar9;
            sVar21 = (uVar9 >> 0x10 | uVar9) + 1;
            str->m = sVar21;
            uStack_60 = 0x13f42d;
            pcVar8 = (char *)realloc(str->s,sVar21);
            if (pcVar8 != (char *)0x0) {
              str->s = pcVar8;
              goto LAB_0013f440;
            }
          }
          lVar31 = lVar31 + 1;
        } while (lVar31 < (pbVar26->core).l_qseq);
      }
      goto LAB_0013f579;
    }
    uVar9 = str->l + 1;
    if (str->m <= uVar9) {
      uVar9 = uVar9 >> 1 | uVar9;
      uVar9 = uVar9 >> 2 | uVar9;
      uVar9 = uVar9 >> 4 | uVar9;
      uVar9 = uVar9 >> 8 | uVar9;
      sVar21 = (uVar9 >> 0x10 | uVar9) + 1;
      str->m = sVar21;
      uStack_60 = 0x13f54a;
      pcVar8 = (char *)realloc(str->s,sVar21);
      if (pcVar8 == (char *)0x0) goto LAB_0013f579;
      str->s = pcVar8;
    }
    sVar24 = str->l;
    str->l = sVar24 + 1;
    str->s[sVar24] = '*';
    pcVar8 = str->s + str->l;
  }
  *pcVar8 = '\0';
LAB_0013f579:
  uVar9 = *(ulong *)&(pbVar26->core).field_0x8;
  iVar27 = (pbVar26->core).l_qseq;
  pdVar28 = (double *)
            (pbVar26->data +
            (long)(iVar27 + 1 >> 1) + (uVar9 >> 0x18 & 0xff) + (long)iVar27 + (uVar9 >> 0x30) * 4);
  do {
    pdVar29 = (double *)((long)pdVar28 + 4);
    if (pbVar26->data + pbVar26->l_data < pdVar29) {
      return (int)str->l;
    }
    cVar19 = *(char *)pdVar28;
    cVar2 = *(char *)((long)pdVar28 + 1);
    bVar32 = *(byte *)((long)pdVar28 + 2);
    uVar9 = str->l + 1;
    if (uVar9 < str->m) {
LAB_0013f630:
      sVar24 = str->l;
      str->l = sVar24 + 1;
      str->s[sVar24] = '\t';
      str->s[str->l] = '\0';
    }
    else {
      uVar9 = uVar9 >> 1 | uVar9;
      uVar9 = uVar9 >> 2 | uVar9;
      uVar9 = uVar9 >> 4 | uVar9;
      uVar9 = uVar9 >> 8 | uVar9;
      sVar21 = (uVar9 >> 0x10 | uVar9) + 1;
      str->m = sVar21;
      uStack_60 = 0x13f617;
      pcVar8 = (char *)realloc(str->s,sVar21);
      if (pcVar8 != (char *)0x0) {
        str->s = pcVar8;
        goto LAB_0013f630;
      }
    }
    uVar9 = str->l + 3;
    if (uVar9 < str->m) {
LAB_0013f6b4:
      sVar24 = str->l;
      pcVar8 = str->s;
      pcVar8[sVar24] = cVar19;
      pcVar8[sVar24 + 1] = cVar2;
      sVar24 = str->l;
      str->l = sVar24 + 2;
      str->s[sVar24 + 2] = '\0';
    }
    else {
      uVar9 = uVar9 >> 1 | uVar9;
      uVar9 = uVar9 >> 2 | uVar9;
      uVar9 = uVar9 >> 4 | uVar9;
      uVar9 = uVar9 >> 8 | uVar9;
      sVar21 = (uVar9 >> 0x10 | uVar9) + 1;
      str->m = sVar21;
      uStack_60 = 0x13f69b;
      pcVar8 = (char *)realloc(str->s,sVar21);
      if (pcVar8 != (char *)0x0) {
        str->s = pcVar8;
        goto LAB_0013f6b4;
      }
    }
    pbVar26 = local_48;
    uVar9 = str->l + 1;
    if (uVar9 < str->m) {
LAB_0013f742:
      sVar24 = str->l;
      str->l = sVar24 + 1;
      str->s[sVar24] = ':';
      str->s[str->l] = '\0';
    }
    else {
      uVar9 = uVar9 >> 1 | uVar9;
      uVar9 = uVar9 >> 2 | uVar9;
      uVar9 = uVar9 >> 4 | uVar9;
      uVar9 = uVar9 >> 8 | uVar9;
      sVar21 = (uVar9 >> 0x10 | uVar9) + 1;
      str->m = sVar21;
      uStack_60 = 0x13f729;
      pcVar8 = (char *)realloc(str->s,sVar21);
      if (pcVar8 != (char *)0x0) {
        str->s = pcVar8;
        goto LAB_0013f742;
      }
    }
    pdVar25 = (double *)((long)pdVar28 + 3);
    if (0x59 < bVar32) {
      switch(bVar32) {
      case 99:
        uVar9 = str->l + 3;
        if (uVar9 < str->m) {
LAB_0013f91b:
          sVar24 = str->l;
          pcVar8 = str->s;
          (pcVar8 + sVar24)[0] = 'i';
          (pcVar8 + sVar24)[1] = ':';
          sVar24 = str->l;
          str->l = sVar24 + 2;
          str->s[sVar24 + 2] = '\0';
        }
        else {
          uVar9 = uVar9 >> 1 | uVar9;
          uVar9 = uVar9 >> 2 | uVar9;
          uVar9 = uVar9 >> 4 | uVar9;
          uVar9 = uVar9 >> 8 | uVar9;
          sVar21 = (uVar9 >> 0x10 | uVar9) + 1;
          str->m = sVar21;
          uStack_60 = 0x13f902;
          pcVar8 = (char *)realloc(str->s,sVar21);
          if (pcVar8 != (char *)0x0) {
            str->s = pcVar8;
            goto LAB_0013f91b;
          }
        }
        bVar32 = *(byte *)pdVar25;
        uVar9 = 0;
        uVar7 = (uint)(byte)((bVar32 ^ (char)bVar32 >> 7) - ((char)bVar32 >> 7));
        do {
          local_58[uVar9] = (char)uVar7 + (char)(uVar7 / 10) * -10 | 0x30;
          uVar9 = uVar9 + 1;
          bVar33 = 9 < uVar7;
          uVar7 = uVar7 / 10;
        } while (bVar33);
        if ((char)bVar32 < '\0') {
          uVar12 = uVar9 & 0xffffffff;
          uVar9 = (ulong)((int)uVar9 + 1);
          local_58[uVar12] = 0x2d;
        }
        uVar12 = str->l + (long)(int)uVar9 + 1;
        if (str->m <= uVar12) {
          uVar12 = uVar12 >> 1 | uVar12;
          uVar12 = uVar12 >> 2 | uVar12;
          uVar12 = uVar12 >> 4 | uVar12;
          uVar12 = uVar12 >> 8 | uVar12;
          sVar21 = (uVar12 >> 0x10 | uVar12) + 1;
          str->m = sVar21;
          uStack_60 = 0x13f9d7;
          pcVar8 = (char *)realloc(str->s,sVar21);
          if (pcVar8 == (char *)0x0) goto LAB_00140a7c;
          str->s = pcVar8;
        }
        iVar27 = (int)uVar9 + 1;
        pbVar18 = local_58 + ((uVar9 & 0xffffffff) - 1);
        do {
          bVar32 = *pbVar18;
          sVar24 = str->l;
          str->l = sVar24 + 1;
          str->s[sVar24] = bVar32;
          iVar27 = iVar27 + -1;
          pbVar18 = pbVar18 + -1;
        } while (1 < iVar27);
        goto LAB_001409d6;
      case 100:
        pdVar28 = (double *)((long)pdVar28 + 0xb);
        if (pdVar28 <= pbVar26->data + pbVar26->l_data) {
          dVar34 = *pdVar25;
          pcVar8 = "d:%g";
LAB_00140107:
          bVar32 = 1;
          uStack_60 = 0x14010e;
          ksprintf(str,pcVar8,dVar34);
          goto LAB_00140a7f;
        }
        break;
      case 0x65:
      case 0x67:
      case 0x68:
        goto switchD_0013f78a_caseD_44;
      case 0x66:
        pdVar28 = (double *)((long)pdVar28 + 7);
        if (pdVar28 <= pbVar26->data + pbVar26->l_data) {
          dVar34 = (double)*(float *)pdVar25;
          pcVar8 = "f:%g";
          goto LAB_00140107;
        }
        break;
      case 0x69:
        pdVar29 = (double *)((long)pdVar28 + 7);
        if (pdVar29 <= pbVar26->data + pbVar26->l_data) {
          uVar9 = str->l + 3;
          if (uVar9 < str->m) {
LAB_0013ffaf:
            sVar24 = str->l;
            pcVar8 = str->s;
            (pcVar8 + sVar24)[0] = 'i';
            (pcVar8 + sVar24)[1] = ':';
            sVar24 = str->l;
            str->l = sVar24 + 2;
            str->s[sVar24 + 2] = '\0';
          }
          else {
            uVar9 = uVar9 >> 1 | uVar9;
            uVar9 = uVar9 >> 2 | uVar9;
            uVar9 = uVar9 >> 4 | uVar9;
            uVar9 = uVar9 >> 8 | uVar9;
            sVar21 = (uVar9 >> 0x10 | uVar9) + 1;
            str->m = sVar21;
            uStack_60 = 0x13ff96;
            pcVar8 = (char *)realloc(str->s,sVar21);
            if (pcVar8 != (char *)0x0) {
              str->s = pcVar8;
              goto LAB_0013ffaf;
            }
          }
          fVar5 = *(float *)pdVar25;
          fVar6 = (float)-(int)fVar5;
          if (0 < (int)fVar5) {
            fVar6 = fVar5;
          }
          uVar9 = 0;
          do {
            local_58[uVar9] = SUB41(fVar6,0) + (char)((uint)fVar6 / 10) * -10 | 0x30;
            uVar9 = uVar9 + 1;
            bVar33 = 9 < (uint)fVar6;
            fVar6 = (float)((uint)fVar6 / 10);
          } while (bVar33);
          if ((int)fVar5 < 0) {
            uVar12 = uVar9 & 0xffffffff;
            uVar9 = (ulong)((int)uVar9 + 1);
            local_58[uVar12] = 0x2d;
          }
          uVar12 = str->l + (long)(int)uVar9 + 1;
          if (str->m <= uVar12) {
            uVar12 = uVar12 >> 1 | uVar12;
            uVar12 = uVar12 >> 2 | uVar12;
            uVar12 = uVar12 >> 4 | uVar12;
            uVar12 = uVar12 >> 8 | uVar12;
            sVar21 = (uVar12 >> 0x10 | uVar12) + 1;
            str->m = sVar21;
            uStack_60 = 0x140064;
            pcVar8 = (char *)realloc(str->s,sVar21);
            if (pcVar8 == (char *)0x0) goto LAB_00140a7c;
            str->s = pcVar8;
          }
          iVar27 = (int)uVar9 + 1;
          pbVar18 = local_58 + ((uVar9 & 0xffffffff) - 1);
          do {
            bVar32 = *pbVar18;
            sVar24 = str->l;
            str->l = sVar24 + 1;
            str->s[sVar24] = bVar32;
            iVar27 = iVar27 + -1;
            pbVar18 = pbVar18 + -1;
          } while (1 < iVar27);
          goto LAB_001400aa;
        }
        break;
      default:
        if (bVar32 == 0x5a) goto switchD_0013f78a_caseD_48;
        if (bVar32 != 0x73) goto switchD_0013f78a_caseD_44;
        pdVar29 = (double *)((long)pdVar28 + 5);
        if (pbVar26->data + pbVar26->l_data < pdVar29) break;
        uVar9 = str->l + 3;
        if (uVar9 < str->m) {
LAB_0013fab4:
          sVar24 = str->l;
          pcVar8 = str->s;
          (pcVar8 + sVar24)[0] = 'i';
          (pcVar8 + sVar24)[1] = ':';
          sVar24 = str->l;
          str->l = sVar24 + 2;
          str->s[sVar24 + 2] = '\0';
        }
        else {
          uVar9 = uVar9 >> 1 | uVar9;
          uVar9 = uVar9 >> 2 | uVar9;
          uVar9 = uVar9 >> 4 | uVar9;
          uVar9 = uVar9 >> 8 | uVar9;
          sVar21 = (uVar9 >> 0x10 | uVar9) + 1;
          str->m = sVar21;
          uStack_60 = 0x13fa9b;
          pcVar8 = (char *)realloc(str->s,sVar21);
          if (pcVar8 != (char *)0x0) {
            str->s = pcVar8;
            goto LAB_0013fab4;
          }
        }
        uVar4 = *(ushort *)pdVar25;
        uVar17 = -uVar4;
        if (0 < (short)uVar4) {
          uVar17 = uVar4;
        }
        uVar9 = 0;
        uVar7 = (uint)uVar17;
        do {
          local_58[uVar9] = (char)uVar7 + (char)(uVar7 / 10) * -10 | 0x30;
          uVar9 = uVar9 + 1;
          bVar33 = 9 < uVar7;
          uVar7 = uVar7 / 10;
        } while (bVar33);
        if ((short)uVar4 < 0) {
          uVar12 = uVar9 & 0xffffffff;
          uVar9 = (ulong)((int)uVar9 + 1);
          local_58[uVar12] = 0x2d;
        }
        uVar12 = str->l + (long)(int)uVar9 + 1;
        if (str->m <= uVar12) {
          uVar12 = uVar12 >> 1 | uVar12;
          uVar12 = uVar12 >> 2 | uVar12;
          uVar12 = uVar12 >> 4 | uVar12;
          uVar12 = uVar12 >> 8 | uVar12;
          sVar21 = (uVar12 >> 0x10 | uVar12) + 1;
          str->m = sVar21;
          uStack_60 = 0x13fb70;
          pcVar8 = (char *)realloc(str->s,sVar21);
          if (pcVar8 == (char *)0x0) goto LAB_00140a7c;
          str->s = pcVar8;
        }
        iVar27 = (int)uVar9 + 1;
        pbVar18 = local_58 + ((uVar9 & 0xffffffff) - 1);
        do {
          bVar32 = *pbVar18;
          sVar24 = str->l;
          str->l = sVar24 + 1;
          str->s[sVar24] = bVar32;
          iVar27 = iVar27 + -1;
          pbVar18 = pbVar18 + -1;
        } while (1 < iVar27);
LAB_001400aa:
        str->s[str->l] = '\0';
        goto LAB_00140a7c;
      }
LAB_0014013b:
      bVar32 = 0;
      pdVar28 = pdVar25;
      goto LAB_00140a7f;
    }
    switch(bVar32) {
    case 0x41:
      uVar9 = str->l + 3;
      if (uVar9 < str->m) {
LAB_0013f7f3:
        sVar24 = str->l;
        pcVar8 = str->s;
        (pcVar8 + sVar24)[0] = 'A';
        (pcVar8 + sVar24)[1] = ':';
        sVar24 = str->l;
        str->l = sVar24 + 2;
        str->s[sVar24 + 2] = '\0';
      }
      else {
        uVar9 = uVar9 >> 1 | uVar9;
        uVar9 = uVar9 >> 2 | uVar9;
        uVar9 = uVar9 >> 4 | uVar9;
        uVar9 = uVar9 >> 8 | uVar9;
        sVar21 = (uVar9 >> 0x10 | uVar9) + 1;
        str->m = sVar21;
        uStack_60 = 0x13f7da;
        pcVar8 = (char *)realloc(str->s,sVar21);
        if (pcVar8 != (char *)0x0) {
          str->s = pcVar8;
          goto LAB_0013f7f3;
        }
      }
      cVar19 = *(char *)pdVar25;
      uVar9 = str->l + 1;
      if (str->m <= uVar9) {
        uVar9 = uVar9 >> 1 | uVar9;
        uVar9 = uVar9 >> 2 | uVar9;
        uVar9 = uVar9 >> 4 | uVar9;
        uVar9 = uVar9 >> 8 | uVar9;
        sVar21 = (uVar9 >> 0x10 | uVar9) + 1;
        str->m = sVar21;
        uStack_60 = 0x13f864;
        pcVar8 = (char *)realloc(str->s,sVar21);
        if (pcVar8 == (char *)0x0) goto LAB_00140a7c;
        str->s = pcVar8;
      }
      sVar24 = str->l;
      str->l = sVar24 + 1;
      str->s[sVar24] = cVar19;
      goto LAB_001409d6;
    case 0x42:
      local_38 = (bam_hdr_t *)(long)(int)*(float *)((long)pdVar28 + 4);
      puVar16 = (uint8_t *)
                ((long)pdVar28 +
                (long)&((bam_hdr_t *)(long)(int)*(float *)((long)pdVar28 + 4))->l_text);
      pdVar28 = pdVar28 + 1;
      bVar33 = puVar16 < pbVar26->data + pbVar26->l_data;
      local_3c = (int)CONCAT71((int7)((ulong)puVar16 >> 8),bVar33);
      if (bVar33) {
        bVar32 = *(byte *)pdVar25;
        uVar9 = str->l + 3;
        if (uVar9 < str->m) {
LAB_001401dc:
          sVar24 = str->l;
          pcVar8 = str->s;
          (pcVar8 + sVar24)[0] = 'B';
          (pcVar8 + sVar24)[1] = ':';
          sVar24 = str->l;
          str->l = sVar24 + 2;
          str->s[sVar24 + 2] = '\0';
        }
        else {
          uVar9 = uVar9 >> 1 | uVar9;
          uVar9 = uVar9 >> 2 | uVar9;
          uVar9 = uVar9 >> 4 | uVar9;
          uVar9 = uVar9 >> 8 | uVar9;
          sVar21 = (uVar9 >> 0x10 | uVar9) + 1;
          str->m = sVar21;
          uStack_60 = 0x1401c3;
          pcVar8 = (char *)realloc(str->s,sVar21);
          if (pcVar8 != (char *)0x0) {
            str->s = pcVar8;
            goto LAB_001401dc;
          }
        }
        uVar9 = str->l + 1;
        if (uVar9 < str->m) {
LAB_00140262:
          sVar24 = str->l;
          str->l = sVar24 + 1;
          str->s[sVar24] = bVar32;
          str->s[str->l] = '\0';
        }
        else {
          uVar9 = uVar9 >> 1 | uVar9;
          uVar9 = uVar9 >> 2 | uVar9;
          uVar9 = uVar9 >> 4 | uVar9;
          uVar9 = uVar9 >> 8 | uVar9;
          sVar21 = (uVar9 >> 0x10 | uVar9) + 1;
          str->m = sVar21;
          uStack_60 = 0x140249;
          pcVar8 = (char *)realloc(str->s,sVar21);
          if (pcVar8 != (char *)0x0) {
            str->s = pcVar8;
            goto LAB_00140262;
          }
        }
        if (0 < (int)local_38) {
          iVar27 = 0;
          do {
            uVar9 = str->l + 1;
            if (uVar9 < str->m) {
LAB_001402f7:
              sVar24 = str->l;
              str->l = sVar24 + 1;
              str->s[sVar24] = ',';
              str->s[str->l] = '\0';
            }
            else {
              uVar9 = uVar9 >> 1 | uVar9;
              uVar9 = uVar9 >> 2 | uVar9;
              uVar9 = uVar9 >> 4 | uVar9;
              uVar9 = uVar9 >> 8 | uVar9;
              sVar21 = (uVar9 >> 0x10 | uVar9) + 1;
              str->m = sVar21;
              uStack_60 = 0x1402de;
              pcVar8 = (char *)realloc(str->s,sVar21);
              if (pcVar8 != (char *)0x0) {
                str->s = pcVar8;
                goto LAB_001402f7;
              }
            }
            if (bVar32 < 99) {
              if (bVar32 != 0x43) {
                if (bVar32 == 0x49) {
                  uStack_60 = 0x140838;
                  kputuw((uint)*(float *)pdVar28,str);
                  goto LAB_00140848;
                }
                if (bVar32 != 0x53) goto LAB_0014084c;
                uVar23 = 1;
                lVar10 = 0;
                lVar15 = 0;
                uVar7 = (uint)*(ushort *)pdVar28;
                iVar30 = 2;
                do {
                  iVar20 = iVar30;
                  uVar9 = (ulong)uVar23;
                  local_58[lVar15] = (char)uVar7 + (char)(uVar7 / 10) * -10 | 0x30;
                  lVar15 = lVar15 + 1;
                  lVar10 = lVar10 + 0x100000000;
                  uVar23 = uVar23 + 1;
                  bVar33 = 9 < uVar7;
                  uVar7 = uVar7 / 10;
                  iVar30 = iVar20 + 1;
                } while (bVar33);
                uVar12 = (lVar10 >> 0x20) + str->l + 1;
                if (uVar12 < str->m) {
LAB_0014042b:
                  pbVar18 = local_58 + (uVar9 - 1);
                  do {
                    bVar3 = *pbVar18;
                    sVar24 = str->l;
                    str->l = sVar24 + 1;
                    str->s[sVar24] = bVar3;
                    iVar20 = iVar20 + -1;
                    pbVar18 = pbVar18 + -1;
                  } while (1 < iVar20);
                  str->s[str->l] = '\0';
                }
                else {
                  uVar12 = uVar12 >> 1 | uVar12;
                  uVar12 = uVar12 >> 2 | uVar12;
                  uVar12 = uVar12 >> 4 | uVar12;
                  uVar12 = uVar12 >> 8 | uVar12;
                  sVar21 = (uVar12 >> 0x10 | uVar12) + 1;
                  str->m = sVar21;
                  uStack_60 = 0x140412;
                  pcVar8 = (char *)realloc(str->s,sVar21);
                  if (pcVar8 != (char *)0x0) {
                    str->s = pcVar8;
                    goto LAB_0014042b;
                  }
                }
                pdVar28 = (double *)((long)pdVar28 + 2);
                pbVar26 = local_48;
                goto LAB_0014084c;
              }
              uVar23 = 1;
              lVar10 = 0;
              lVar15 = 0;
              uVar7 = (uint)*(byte *)pdVar28;
              iVar30 = 2;
              do {
                iVar20 = iVar30;
                uVar9 = (ulong)uVar23;
                local_58[lVar15] = (char)uVar7 + (char)(uVar7 / 10) * -10 | 0x30;
                lVar15 = lVar15 + 1;
                lVar10 = lVar10 + 0x100000000;
                uVar23 = uVar23 + 1;
                bVar33 = 9 < uVar7;
                uVar7 = uVar7 / 10;
                iVar30 = iVar20 + 1;
              } while (bVar33);
              uVar12 = (lVar10 >> 0x20) + str->l + 1;
              if (uVar12 < str->m) {
LAB_00140620:
                pbVar18 = local_58 + (uVar9 - 1);
                do {
                  bVar3 = *pbVar18;
                  sVar24 = str->l;
                  str->l = sVar24 + 1;
                  str->s[sVar24] = bVar3;
                  iVar20 = iVar20 + -1;
                  pbVar18 = pbVar18 + -1;
                } while (1 < iVar20);
                str->s[str->l] = '\0';
              }
              else {
                uVar12 = uVar12 >> 1 | uVar12;
                uVar12 = uVar12 >> 2 | uVar12;
                uVar12 = uVar12 >> 4 | uVar12;
                uVar12 = uVar12 >> 8 | uVar12;
                sVar21 = (uVar12 >> 0x10 | uVar12) + 1;
                str->m = sVar21;
                uStack_60 = 0x140607;
                pcVar8 = (char *)realloc(str->s,sVar21);
                if (pcVar8 != (char *)0x0) {
                  str->s = pcVar8;
                  goto LAB_00140620;
                }
              }
              pdVar28 = (double *)((long)pdVar28 + 1);
              pbVar26 = local_48;
            }
            else if (bVar32 < 0x69) {
              if (bVar32 != 99) {
                if (bVar32 == 0x66) {
                  uStack_60 = 0x140351;
                  ksprintf(str,"%g",(double)*(float *)pdVar28);
                  goto LAB_00140848;
                }
                goto LAB_0014084c;
              }
              bVar3 = *(byte *)pdVar28;
              uVar9 = 0;
              uVar7 = (uint)(byte)((bVar3 ^ (char)bVar3 >> 7) - ((char)bVar3 >> 7));
              do {
                local_58[uVar9] = (char)uVar7 + (char)(uVar7 / 10) * -10 | 0x30;
                uVar9 = uVar9 + 1;
                bVar33 = 9 < uVar7;
                uVar7 = uVar7 / 10;
              } while (bVar33);
              if ((char)bVar3 < '\0') {
                uVar12 = uVar9 & 0xffffffff;
                uVar9 = (ulong)((int)uVar9 + 1);
                local_58[uVar12] = 0x2d;
              }
              uVar12 = str->l + (long)(int)uVar9 + 1;
              if (uVar12 < str->m) {
LAB_00140711:
                iVar30 = (int)uVar9 + 1;
                pbVar18 = local_58 + ((uVar9 & 0xffffffff) - 1);
                do {
                  bVar3 = *pbVar18;
                  sVar24 = str->l;
                  str->l = sVar24 + 1;
                  str->s[sVar24] = bVar3;
                  iVar30 = iVar30 + -1;
                  pbVar18 = pbVar18 + -1;
                } while (1 < iVar30);
                str->s[str->l] = '\0';
              }
              else {
                uVar12 = uVar12 >> 1 | uVar12;
                uVar12 = uVar12 >> 2 | uVar12;
                uVar12 = uVar12 >> 4 | uVar12;
                uVar12 = uVar12 >> 8 | uVar12;
                sVar21 = (uVar12 >> 0x10 | uVar12) + 1;
                str->m = sVar21;
                uStack_60 = 0x1406f8;
                pcVar8 = (char *)realloc(str->s,sVar21);
                if (pcVar8 != (char *)0x0) {
                  str->s = pcVar8;
                  goto LAB_00140711;
                }
              }
              pdVar28 = (double *)((long)pdVar28 + 1);
            }
            else {
              if (bVar32 == 0x69) {
                fVar5 = *(float *)pdVar28;
                fVar6 = (float)-(int)fVar5;
                if (0 < (int)fVar5) {
                  fVar6 = fVar5;
                }
                uVar9 = 0;
                do {
                  local_58[uVar9] = SUB41(fVar6,0) + (char)((uint)fVar6 / 10) * -10 | 0x30;
                  uVar9 = uVar9 + 1;
                  bVar33 = 9 < (uint)fVar6;
                  fVar6 = (float)((uint)fVar6 / 10);
                } while (bVar33);
                if ((int)fVar5 < 0) {
                  uVar12 = uVar9 & 0xffffffff;
                  uVar9 = (ulong)((int)uVar9 + 1);
                  local_58[uVar12] = 0x2d;
                }
                uVar12 = str->l + (long)(int)uVar9 + 1;
                if (str->m <= uVar12) {
                  uVar12 = uVar12 >> 1 | uVar12;
                  uVar12 = uVar12 >> 2 | uVar12;
                  uVar12 = uVar12 >> 4 | uVar12;
                  uVar12 = uVar12 >> 8 | uVar12;
                  sVar21 = (uVar12 >> 0x10 | uVar12) + 1;
                  str->m = sVar21;
                  uStack_60 = 0x1407de;
                  pcVar8 = (char *)realloc(str->s,sVar21);
                  if (pcVar8 == (char *)0x0) goto LAB_00140848;
                  str->s = pcVar8;
                }
                iVar30 = (int)uVar9 + 1;
                pbVar18 = local_58 + ((uVar9 & 0xffffffff) - 1);
                do {
                  bVar3 = *pbVar18;
                  sVar24 = str->l;
                  str->l = sVar24 + 1;
                  str->s[sVar24] = bVar3;
                  iVar30 = iVar30 + -1;
                  pbVar18 = pbVar18 + -1;
                } while (1 < iVar30);
                str->s[str->l] = '\0';
LAB_00140848:
                pdVar28 = (double *)((long)pdVar28 + 4);
                goto LAB_0014084c;
              }
              if (bVar32 != 0x73) goto LAB_0014084c;
              uVar4 = *(ushort *)pdVar28;
              uVar17 = -uVar4;
              if (0 < (short)uVar4) {
                uVar17 = uVar4;
              }
              uVar9 = 0;
              uVar7 = (uint)uVar17;
              do {
                local_58[uVar9] = (char)uVar7 + (char)(uVar7 / 10) * -10 | 0x30;
                uVar9 = uVar9 + 1;
                bVar33 = 9 < uVar7;
                uVar7 = uVar7 / 10;
              } while (bVar33);
              if ((short)uVar4 < 0) {
                uVar12 = uVar9 & 0xffffffff;
                uVar9 = (ulong)((int)uVar9 + 1);
                local_58[uVar12] = 0x2d;
              }
              uVar12 = str->l + (long)(int)uVar9 + 1;
              if (uVar12 < str->m) {
LAB_0014052c:
                iVar30 = (int)uVar9 + 1;
                pbVar18 = local_58 + ((uVar9 & 0xffffffff) - 1);
                do {
                  bVar3 = *pbVar18;
                  sVar24 = str->l;
                  str->l = sVar24 + 1;
                  str->s[sVar24] = bVar3;
                  iVar30 = iVar30 + -1;
                  pbVar18 = pbVar18 + -1;
                } while (1 < iVar30);
                str->s[str->l] = '\0';
              }
              else {
                uVar12 = uVar12 >> 1 | uVar12;
                uVar12 = uVar12 >> 2 | uVar12;
                uVar12 = uVar12 >> 4 | uVar12;
                uVar12 = uVar12 >> 8 | uVar12;
                sVar21 = (uVar12 >> 0x10 | uVar12) + 1;
                str->m = sVar21;
                uStack_60 = 0x140513;
                pcVar8 = (char *)realloc(str->s,sVar21);
                if (pcVar8 != (char *)0x0) {
                  str->s = pcVar8;
                  goto LAB_0014052c;
                }
              }
              pdVar28 = (double *)((long)pdVar28 + 2);
            }
LAB_0014084c:
            iVar27 = iVar27 + 1;
          } while (iVar27 != (int)local_38);
        }
      }
      bVar32 = (byte)local_3c;
      break;
    case 0x43:
      uVar9 = str->l + 3;
      if (uVar9 < str->m) {
LAB_001408cd:
        sVar24 = str->l;
        pcVar8 = str->s;
        (pcVar8 + sVar24)[0] = 'i';
        (pcVar8 + sVar24)[1] = ':';
        sVar24 = str->l;
        str->l = sVar24 + 2;
        str->s[sVar24 + 2] = '\0';
      }
      else {
        uVar9 = uVar9 >> 1 | uVar9;
        uVar9 = uVar9 >> 2 | uVar9;
        uVar9 = uVar9 >> 4 | uVar9;
        uVar9 = uVar9 >> 8 | uVar9;
        sVar21 = (uVar9 >> 0x10 | uVar9) + 1;
        str->m = sVar21;
        uStack_60 = 0x1408b4;
        pcVar8 = (char *)realloc(str->s,sVar21);
        if (pcVar8 != (char *)0x0) {
          str->s = pcVar8;
          goto LAB_001408cd;
        }
      }
      uVar23 = 1;
      lVar10 = 0;
      lVar15 = 0;
      iVar27 = 2;
      uVar7 = (uint)*(byte *)pdVar25;
      do {
        iVar30 = iVar27;
        uVar9 = (ulong)uVar23;
        local_58[lVar15] = (char)uVar7 + (char)(uVar7 / 10) * -10 | 0x30;
        lVar15 = lVar15 + 1;
        lVar10 = lVar10 + 0x100000000;
        uVar23 = uVar23 + 1;
        bVar33 = 9 < uVar7;
        iVar27 = iVar30 + 1;
        uVar7 = uVar7 / 10;
      } while (bVar33);
      uVar12 = (lVar10 >> 0x20) + str->l + 1;
      if (str->m <= uVar12) {
        uVar12 = uVar12 >> 1 | uVar12;
        uVar12 = uVar12 >> 2 | uVar12;
        uVar12 = uVar12 >> 4 | uVar12;
        uVar12 = uVar12 >> 8 | uVar12;
        sVar21 = (uVar12 >> 0x10 | uVar12) + 1;
        str->m = sVar21;
        uStack_60 = 0x14098f;
        pcVar8 = (char *)realloc(str->s,sVar21);
        if (pcVar8 == (char *)0x0) goto LAB_00140a7c;
        str->s = pcVar8;
      }
      pbVar18 = local_58 + (uVar9 - 1);
      do {
        bVar32 = *pbVar18;
        sVar24 = str->l;
        str->l = sVar24 + 1;
        str->s[sVar24] = bVar32;
        iVar30 = iVar30 + -1;
        pbVar18 = pbVar18 + -1;
      } while (1 < iVar30);
LAB_001409d6:
      str->s[str->l] = '\0';
LAB_00140a7c:
      bVar32 = 1;
      pdVar28 = pdVar29;
      break;
    case 0x44:
    case 0x45:
    case 0x46:
    case 0x47:
      goto switchD_0013f78a_caseD_44;
    case 0x48:
switchD_0013f78a_caseD_48:
      uVar9 = str->l + 1;
      if (uVar9 < str->m) {
LAB_0013fc25:
        sVar24 = str->l;
        str->l = sVar24 + 1;
        str->s[sVar24] = bVar32;
        str->s[str->l] = '\0';
      }
      else {
        uVar9 = uVar9 >> 1 | uVar9;
        uVar9 = uVar9 >> 2 | uVar9;
        uVar9 = uVar9 >> 4 | uVar9;
        uVar9 = uVar9 >> 8 | uVar9;
        sVar21 = (uVar9 >> 0x10 | uVar9) + 1;
        str->m = sVar21;
        uStack_60 = 0x13fc0c;
        pcVar8 = (char *)realloc(str->s,sVar21);
        if (pcVar8 != (char *)0x0) {
          str->s = pcVar8;
          goto LAB_0013fc25;
        }
      }
      uVar9 = str->l + 1;
      if (uVar9 < str->m) {
LAB_0013fca8:
        sVar24 = str->l;
        str->l = sVar24 + 1;
        str->s[sVar24] = ':';
        str->s[str->l] = '\0';
      }
      else {
        uVar9 = uVar9 >> 1 | uVar9;
        uVar9 = uVar9 >> 2 | uVar9;
        uVar9 = uVar9 >> 4 | uVar9;
        uVar9 = uVar9 >> 8 | uVar9;
        sVar21 = (uVar9 >> 0x10 | uVar9) + 1;
        str->m = sVar21;
        uStack_60 = 0x13fc8f;
        pcVar8 = (char *)realloc(str->s,sVar21);
        if (pcVar8 != (char *)0x0) {
          str->s = pcVar8;
          goto LAB_0013fca8;
        }
      }
      bVar32 = pdVar25 < pbVar26->data + pbVar26->l_data;
      if ((bool)bVar32) {
        cVar19 = *(char *)pdVar25;
        while (cVar19 != '\0') {
          uVar9 = str->l + 1;
          if (uVar9 < str->m) {
LAB_0013fd4f:
            sVar24 = str->l;
            str->l = sVar24 + 1;
            str->s[sVar24] = cVar19;
            str->s[str->l] = '\0';
          }
          else {
            uVar9 = uVar9 >> 1 | uVar9;
            uVar9 = uVar9 >> 2 | uVar9;
            uVar9 = uVar9 >> 4 | uVar9;
            uVar9 = uVar9 >> 8 | uVar9;
            sVar21 = (uVar9 >> 0x10 | uVar9) + 1;
            str->m = sVar21;
            uStack_60 = 0x13fd36;
            pcVar8 = (char *)realloc(str->s,sVar21);
            if (pcVar8 != (char *)0x0) {
              str->s = pcVar8;
              goto LAB_0013fd4f;
            }
          }
          bVar32 = pdVar29 < pbVar26->data + pbVar26->l_data;
          pdVar25 = pdVar29;
          if (!(bool)bVar32) break;
          cVar19 = *(char *)pdVar29;
          pdVar29 = (double *)((long)pdVar29 + 1);
        }
      }
      pdVar28 = (double *)((ulong)bVar32 + (long)pdVar25);
      break;
    case 0x49:
      pdVar29 = (double *)((long)pdVar28 + 7);
      if (pbVar26->data + pbVar26->l_data < pdVar29) goto LAB_0014013b;
      uVar9 = str->l + 3;
      if (uVar9 < str->m) {
LAB_00140a3d:
        sVar24 = str->l;
        pcVar8 = str->s;
        (pcVar8 + sVar24)[0] = 'i';
        (pcVar8 + sVar24)[1] = ':';
        sVar24 = str->l;
        str->l = sVar24 + 2;
        str->s[sVar24 + 2] = '\0';
      }
      else {
        uVar9 = uVar9 >> 1 | uVar9;
        uVar9 = uVar9 >> 2 | uVar9;
        uVar9 = uVar9 >> 4 | uVar9;
        uVar9 = uVar9 >> 8 | uVar9;
        sVar21 = (uVar9 >> 0x10 | uVar9) + 1;
        str->m = sVar21;
        uStack_60 = 0x140a34;
        pcVar8 = (char *)realloc(str->s,sVar21);
        if (pcVar8 != (char *)0x0) {
          str->s = pcVar8;
          goto LAB_00140a3d;
        }
      }
      uStack_60 = 0x140a69;
      kputuw((uint)*(float *)pdVar25,str);
      goto LAB_00140a7c;
    default:
      if (bVar32 == 0x53) {
        pdVar29 = (double *)((long)pdVar28 + 5);
        if (pbVar26->data + pbVar26->l_data < pdVar29) goto LAB_0014013b;
        uVar9 = str->l + 3;
        if (uVar9 < str->m) {
LAB_0013fe1d:
          sVar24 = str->l;
          pcVar8 = str->s;
          (pcVar8 + sVar24)[0] = 'i';
          (pcVar8 + sVar24)[1] = ':';
          sVar24 = str->l;
          str->l = sVar24 + 2;
          str->s[sVar24 + 2] = '\0';
        }
        else {
          uVar9 = uVar9 >> 1 | uVar9;
          uVar9 = uVar9 >> 2 | uVar9;
          uVar9 = uVar9 >> 4 | uVar9;
          uVar9 = uVar9 >> 8 | uVar9;
          sVar21 = (uVar9 >> 0x10 | uVar9) + 1;
          str->m = sVar21;
          uStack_60 = 0x13fe04;
          pcVar8 = (char *)realloc(str->s,sVar21);
          if (pcVar8 != (char *)0x0) {
            str->s = pcVar8;
            goto LAB_0013fe1d;
          }
        }
        uVar23 = 1;
        lVar10 = 0;
        lVar15 = 0;
        iVar27 = 2;
        uVar7 = (uint)*(ushort *)pdVar25;
        do {
          iVar30 = iVar27;
          uVar9 = (ulong)uVar23;
          local_58[lVar15] = (char)uVar7 + (char)(uVar7 / 10) * -10 | 0x30;
          lVar15 = lVar15 + 1;
          lVar10 = lVar10 + 0x100000000;
          uVar23 = uVar23 + 1;
          bVar33 = 9 < uVar7;
          iVar27 = iVar30 + 1;
          uVar7 = uVar7 / 10;
        } while (bVar33);
        uVar12 = (lVar10 >> 0x20) + str->l + 1;
        if (str->m <= uVar12) {
          uVar12 = uVar12 >> 1 | uVar12;
          uVar12 = uVar12 >> 2 | uVar12;
          uVar12 = uVar12 >> 4 | uVar12;
          uVar12 = uVar12 >> 8 | uVar12;
          sVar21 = (uVar12 >> 0x10 | uVar12) + 1;
          str->m = sVar21;
          uStack_60 = 0x13fedf;
          pcVar8 = (char *)realloc(str->s,sVar21);
          if (pcVar8 == (char *)0x0) goto LAB_00140a7c;
          str->s = pcVar8;
        }
        pbVar18 = local_58 + (uVar9 - 1);
        do {
          bVar32 = *pbVar18;
          sVar24 = str->l;
          str->l = sVar24 + 1;
          str->s[sVar24] = bVar32;
          iVar30 = iVar30 + -1;
          pbVar18 = pbVar18 + -1;
        } while (1 < iVar30);
        goto LAB_001400aa;
      }
      goto switchD_0013f78a_caseD_44;
    }
LAB_00140a7f:
    if (bVar32 == 0) {
      return -1;
    }
  } while( true );
switchD_0013f78a_caseD_44:
  pdVar29 = pdVar25;
  goto LAB_00140a7c;
}

Assistant:

int sam_format1(const bam_hdr_t *h, const bam1_t *b, kstring_t *str)
{
    int i;
    uint8_t *s;
    const bam1_core_t *c = &b->core;

    str->l = 0;
    kputsn(bam_get_qname(b), c->l_qname-1, str); kputc('\t', str); // query name
    kputw(c->flag, str); kputc('\t', str); // flag
    if (c->tid >= 0) { // chr
        kputs(h->target_name[c->tid] , str);
        kputc('\t', str);
    } else kputsn("*\t", 2, str);
    kputw(c->pos + 1, str); kputc('\t', str); // pos
    kputw(c->qual, str); kputc('\t', str); // qual
    if (c->n_cigar) { // cigar
        uint32_t *cigar = bam_get_cigar(b);
        for (i = 0; i < c->n_cigar; ++i) {
            kputw(bam_cigar_oplen(cigar[i]), str);
            kputc(bam_cigar_opchr(cigar[i]), str);
        }
    } else kputc('*', str);
    kputc('\t', str);
    if (c->mtid < 0) kputsn("*\t", 2, str); // mate chr
    else if (c->mtid == c->tid) kputsn("=\t", 2, str);
    else {
        kputs(h->target_name[c->mtid], str);
        kputc('\t', str);
    }
    kputw(c->mpos + 1, str); kputc('\t', str); // mate pos
    kputw(c->isize, str); kputc('\t', str); // template len
    if (c->l_qseq) { // seq and qual
        uint8_t *s = bam_get_seq(b);
        for (i = 0; i < c->l_qseq; ++i) kputc("=ACMGRSVTWYHKDBN"[bam_seqi(s, i)], str);
        kputc('\t', str);
        s = bam_get_qual(b);
        if (s[0] == 0xff) kputc('*', str);
        else for (i = 0; i < c->l_qseq; ++i) kputc(s[i] + 33, str);
    } else kputsn("*\t*", 3, str);
    s = bam_get_aux(b); // aux
    while (s+4 <= b->data + b->l_data) {
        uint8_t type, key[2];
        key[0] = s[0]; key[1] = s[1];
        s += 2; type = *s++;
        kputc('\t', str); kputsn((char*)key, 2, str); kputc(':', str);
        if (type == 'A') {
            kputsn("A:", 2, str);
            kputc(*s, str);
            ++s;
        } else if (type == 'C') {
            kputsn("i:", 2, str);
            kputw(*s, str);
            ++s;
        } else if (type == 'c') {
            kputsn("i:", 2, str);
            kputw(*(int8_t*)s, str);
            ++s;
        } else if (type == 'S') {
            if (s+2 <= b->data + b->l_data) {
                kputsn("i:", 2, str);
                kputw(*(uint16_t*)s, str);
                s += 2;
            } else return -1;
        } else if (type == 's') {
            if (s+2 <= b->data + b->l_data) {
                kputsn("i:", 2, str);
                kputw(*(int16_t*)s, str);
                s += 2;
            } else return -1;
        } else if (type == 'I') {
            if (s+4 <= b->data + b->l_data) {
                kputsn("i:", 2, str);
                kputuw(*(uint32_t*)s, str);
                s += 4;
            } else return -1;
        } else if (type == 'i') {
            if (s+4 <= b->data + b->l_data) {
                kputsn("i:", 2, str);
                kputw(*(int32_t*)s, str);
                s += 4;
            } else return -1;
        } else if (type == 'f') {
            if (s+4 <= b->data + b->l_data) {
                ksprintf(str, "f:%g", *(float*)s);
                s += 4;
            } else return -1;

        } else if (type == 'd') {
            if (s+8 <= b->data + b->l_data) {
                ksprintf(str, "d:%g", *(double*)s);
                s += 8;
            } else return -1;
        } else if (type == 'Z' || type == 'H') {
            kputc(type, str); kputc(':', str);
            while (s < b->data + b->l_data && *s) kputc(*s++, str);
            if (s >= b->data + b->l_data)
                return -1;
            ++s;
        } else if (type == 'B') {
            uint8_t sub_type = *(s++);
            int32_t n;
            memcpy(&n, s, 4);
            s += 4; // no point to the start of the array
            if (s + n >= b->data + b->l_data)
                return -1;
            kputsn("B:", 2, str); kputc(sub_type, str); // write the typing
            for (i = 0; i < n; ++i) { // FIXME: for better performance, put the loop after "if"
                kputc(',', str);
                if ('c' == sub_type)      { kputw(*(int8_t*)s, str); ++s; }
                else if ('C' == sub_type) { kputw(*(uint8_t*)s, str); ++s; }
                else if ('s' == sub_type) { kputw(*(int16_t*)s, str); s += 2; }
                else if ('S' == sub_type) { kputw(*(uint16_t*)s, str); s += 2; }
                else if ('i' == sub_type) { kputw(*(int32_t*)s, str); s += 4; }
                else if ('I' == sub_type) { kputuw(*(uint32_t*)s, str); s += 4; }
                else if ('f' == sub_type) { ksprintf(str, "%g", *(float*)s); s += 4; }
            }
        }
    }
    return str->l;
}